

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error IsMacResource(FT_Library library,FT_Stream stream,FT_Long resource_offset,
                      FT_Long face_index,FT_Face *aface)

{
  FT_Byte *pFVar1;
  ushort uVar2;
  FT_Stream pFVar3;
  FT_UInt16 FVar4;
  FT_Error FVar5;
  FT_UInt32 FVar6;
  uint uVar7;
  unsigned_long uVar8;
  FT_Byte *base;
  int *buffer;
  FT_ULong count_00;
  FT_Memory pFVar9;
  FT_Parameter *params;
  char *driver_name;
  FT_Face *aface_00;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  uint local_ac;
  long local_a8;
  FT_Long *data_offsets;
  FT_ULong local_98;
  FT_Library local_90;
  FT_Memory local_88;
  uint local_7c;
  ulong local_78;
  FT_Stream local_70;
  FT_Memory local_68;
  FT_Face *local_60;
  FT_Long count;
  FT_Memory local_50;
  FT_Long local_48;
  FT_Long rdata_pos;
  FT_Long map_offset;
  
  pFVar9 = library->memory;
  FVar5 = FT_Raccess_Get_HeaderInfo(library,stream,resource_offset,&map_offset,&rdata_pos);
  if (FVar5 != 0) {
    return FVar5;
  }
  local_60 = aface;
  local_50 = pFVar9;
  FVar5 = FT_Raccess_Get_DataOffsets
                    (library,stream,map_offset,rdata_pos,0x504f5354,'\x01',&data_offsets,&count);
  if (FVar5 == 0) {
    local_88 = (FT_Memory)data_offsets;
    local_ac = 1;
    uVar7 = 1;
    if (face_index + 1U < 2) {
      local_68 = library->memory;
      if (count < 1) {
        uVar11 = 0;
        local_90 = library;
      }
      else {
        lVar12 = 0;
        uVar11 = 0;
        local_90 = library;
        do {
          uVar10 = *(ulong *)((long)local_88 + lVar12 * 8);
          if (stream->read == (FT_Stream_IoFunc)0x0) {
            bVar14 = uVar10 <= stream->size;
          }
          else {
            uVar8 = (*stream->read)(stream,uVar10,(uchar *)0x0,0);
            bVar14 = uVar8 == 0;
          }
          if (!bVar14) {
            local_ac = 0x55;
            uVar7 = local_ac;
            goto LAB_0021df3b;
          }
          stream->pos = uVar10;
          local_ac = 0;
          FVar6 = FT_Stream_ReadULong(stream,(FT_Error *)&local_ac);
          uVar7 = local_ac;
          if (local_ac != 0) goto LAB_0021df3b;
          if ((0xffffff < FVar6) || (0xffffff - (ulong)FVar6 < uVar11 + 6)) {
            local_ac = 9;
            uVar7 = local_ac;
            goto LAB_0021df3b;
          }
          uVar11 = uVar11 + FVar6 + 6;
          lVar12 = lVar12 + 1;
        } while (count != lVar12);
      }
      uVar10 = uVar11 + 2;
      if (uVar10 < 6) {
        local_ac = 10;
        uVar7 = local_ac;
      }
      else {
        if ((long)uVar10 < 1) {
          local_ac = 6;
          base = (FT_Byte *)0x0;
        }
        else {
          base = (FT_Byte *)(*local_68->alloc)(local_68,uVar10);
          local_ac = (uint)(base == (FT_Byte *)0x0) << 6;
        }
        uVar7 = local_ac;
        if (local_ac == 0) {
          base[0] = 0x80;
          base[1] = '\x01';
          base[2] = '\0';
          base[3] = '\0';
          base[4] = '\0';
          base[5] = '\0';
          local_78 = uVar10;
          if (count < 1) {
            local_a8 = 2;
            uVar10 = 6;
            local_98 = 0;
          }
          else {
            local_48 = count;
            local_7c = 1;
            uVar10 = 6;
            local_a8 = 2;
            lVar12 = 0;
            local_98 = 0;
            local_ac = 0;
            do {
              uVar13 = *(ulong *)((long)local_88 + lVar12 * 8);
              if (stream->read == (FT_Stream_IoFunc)0x0) {
                bVar14 = uVar13 <= stream->size;
              }
              else {
                uVar8 = (*stream->read)(stream,uVar13,(uchar *)0x0,0);
                bVar14 = uVar8 == 0;
              }
              if (!bVar14) {
                local_ac = 0x55;
                goto LAB_0021df1e;
              }
              stream->pos = uVar13;
              local_ac = 0;
              FVar6 = FT_Stream_ReadULong(stream,(FT_Error *)&local_ac);
              if (local_ac != 0) goto LAB_0021df1e;
              if ((int)FVar6 < 0) {
                local_ac = 9;
                goto LAB_0021df1e;
              }
              FVar4 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_ac);
              if (local_ac != 0) goto LAB_0021df1e;
              local_ac = 10;
              if (0xff < FVar4) {
                uVar2 = FVar4 >> 8;
                count_00 = (ulong)FVar6 - 2;
                if (FVar6 < 3) {
                  count_00 = 0;
                }
                if (local_7c == uVar2) {
                  uVar13 = uVar10;
                  local_98 = local_98 + count_00;
                }
                else {
                  if (local_78 < local_a8 + 3U) goto LAB_0021df1e;
                  *(int *)(base + local_a8) = (int)local_98;
                  if (uVar2 == 5) break;
                  uVar13 = uVar10 + 6;
                  if (local_78 < uVar13) goto LAB_0021df1e;
                  base[uVar10] = 0x80;
                  local_a8 = uVar10 + 2;
                  base[uVar10 + 1] = (FT_Byte)(FVar4 >> 8);
                  pFVar1 = base + uVar10 + 2;
                  pFVar1[0] = '\0';
                  pFVar1[1] = '\0';
                  pFVar1[2] = '\0';
                  pFVar1[3] = '\0';
                  local_7c = (uint)uVar2;
                  local_98 = count_00;
                }
                if (((uVar11 < uVar13) || (uVar10 = count_00 + uVar13, uVar11 < uVar10)) ||
                   (local_ac = FT_Stream_Read(stream,base + uVar13,count_00), local_ac != 0))
                goto LAB_0021df1e;
              }
              lVar12 = lVar12 + 1;
            } while (local_48 != lVar12);
          }
          local_ac = 10;
          if ((local_78 < uVar10 + 2) ||
             ((base + uVar10)[0] = 0x80, (base + uVar10)[1] = '\x03', local_78 < local_a8 + 3U)) {
LAB_0021df1e:
            local_ac = (uint)(local_ac != 0);
            (*local_68->free)(local_68,base);
            uVar7 = local_ac;
          }
          else {
            *(int *)(base + local_a8) = (int)local_98;
            uVar7 = open_face_from_buffer(local_90,base,uVar10 + 2,0,"type1",local_60);
          }
        }
      }
    }
LAB_0021df3b:
    if (data_offsets != (FT_Long *)0x0) {
      (*local_50->free)(local_50,data_offsets);
    }
    if (uVar7 != 0) {
      return uVar7;
    }
    count = 1;
    uVar7 = 0;
  }
  else {
    params = (FT_Parameter *)0x73666e74;
    aface_00 = (FT_Face *)0x0;
    FVar5 = FT_Raccess_Get_DataOffsets
                      (library,stream,map_offset,rdata_pos,0x73666e74,'\0',&data_offsets,&count);
    if (FVar5 != 0) {
      return FVar5;
    }
    uVar11 = face_index % count >> 0x3f ^ face_index % count;
    pFVar9 = (FT_Memory)data_offsets;
    uVar7 = 1;
    if ((long)uVar11 < count) {
      local_88 = library->memory;
      uVar10 = data_offsets[uVar11];
      local_70 = stream;
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        bVar14 = uVar10 <= stream->size;
      }
      else {
        uVar8 = (*stream->read)(stream,uVar10,(uchar *)0x0,0);
        bVar14 = uVar8 == 0;
      }
      uVar7 = 0x55;
      local_ac = uVar7;
      if (bVar14) {
        local_70->pos = uVar10;
        local_68 = (FT_Memory)data_offsets;
        local_ac = 0;
        local_90 = library;
        FVar6 = FT_Stream_ReadULong(local_70,(FT_Error *)&local_ac);
        pFVar9 = local_68;
        pFVar3 = local_70;
        uVar7 = local_ac;
        if (((local_ac == 0) && (uVar13 = (ulong)FVar6, uVar7 = 1, uVar13 != 0)) &&
           ((uVar7 = 9, FVar6 < 0x1000000 &&
            (local_ac = open_face_PS_from_sfnt_stream
                                  (local_90,local_70,uVar11,(FT_Int)local_60,params,aface_00),
            uVar7 = local_ac, local_ac != 0)))) {
          uVar10 = uVar10 + 4;
          if (pFVar3->read == (FT_Stream_IoFunc)0x0) {
            bVar14 = uVar10 <= pFVar3->size;
          }
          else {
            uVar8 = (*pFVar3->read)(pFVar3,uVar10,(uchar *)0x0,0);
            bVar14 = uVar8 == 0;
          }
          if (bVar14) {
            local_70->pos = uVar10;
            local_ac = 0;
            buffer = (int *)(*local_88->alloc)(local_88,uVar13);
            local_ac = (uint)(buffer == (int *)0x0) << 6;
            uVar7 = local_ac;
            if (buffer != (int *)0x0) {
              local_ac = FT_Stream_Read(local_70,(FT_Byte *)buffer,uVar13);
              if (local_ac == 0) {
                if (FVar6 < 5) {
                  driver_name = "truetype";
                }
                else {
                  driver_name = "truetype";
                  if (*buffer == 0x4f54544f) {
                    driver_name = "cff";
                  }
                }
                uVar7 = open_face_from_buffer
                                  (local_90,(FT_Byte *)buffer,uVar13,0,driver_name,local_60);
                local_ac = uVar7;
              }
              else {
                (*local_88->free)(local_88,buffer);
                uVar7 = local_ac;
              }
            }
          }
          else {
            local_ac = 0x55;
            uVar7 = local_ac;
          }
        }
      }
    }
    if (pFVar9 != (FT_Memory)0x0) {
      (*local_50->free)(local_50,pFVar9);
    }
    if (uVar7 != 0) {
      return uVar7;
    }
  }
  (*local_60)->num_faces = count;
  return uVar7;
}

Assistant:

static FT_Error
  IsMacResource( FT_Library  library,
                 FT_Stream   stream,
                 FT_Long     resource_offset,
                 FT_Long     face_index,
                 FT_Face    *aface )
  {
    FT_Memory  memory = library->memory;
    FT_Error   error;
    FT_Long    map_offset, rdata_pos;
    FT_Long    *data_offsets;
    FT_Long    count;


    error = FT_Raccess_Get_HeaderInfo( library, stream, resource_offset,
                                       &map_offset, &rdata_pos );
    if ( error )
      return error;

    /* POST resources must be sorted to concatenate properly */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_POST, TRUE,
                                        &data_offsets, &count );
    if ( !error )
    {
      error = Mac_Read_POST_Resource( library, stream, data_offsets, count,
                                      face_index, aface );
      FT_FREE( data_offsets );
      /* POST exists in an LWFN providing a single face */
      if ( !error )
        (*aface)->num_faces = 1;
      return error;
    }

    /* sfnt resources should not be sorted to preserve the face order by
       QuickDraw API */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_sfnt, FALSE,
                                        &data_offsets, &count );
    if ( !error )
    {
      FT_Long  face_index_internal = face_index % count;


      error = Mac_Read_sfnt_Resource( library, stream, data_offsets, count,
                                      face_index_internal, aface );
      FT_FREE( data_offsets );
      if ( !error )
        (*aface)->num_faces = count;
    }

    return error;
  }